

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l5_full.c
# Opt level: O3

int picnic_l5_full_keygen(picnic_l5_full_publickey_t *pk,picnic_l5_full_privatekey_t *sk)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  
  iVar5 = -1;
  if (sk != (picnic_l5_full_privatekey_t *)0x0 && pk != (picnic_l5_full_publickey_t *)0x0) {
    iVar4 = rand_bits(sk->data,0xff);
    if (iVar4 == 0) {
      iVar4 = rand_bits(sk->data + 0x40,0xff);
      if (iVar4 == 0) {
        iVar4 = picnic_l5_full_sk_to_pk(sk,pk);
        if (iVar4 == 0) {
          uVar1 = *(undefined8 *)(pk->data + 8);
          uVar2 = *(undefined8 *)(pk->data + 0x10);
          uVar3 = *(undefined8 *)(pk->data + 0x18);
          iVar5 = 0;
          *(undefined8 *)(sk->data + 0x20) = *(undefined8 *)pk->data;
          *(undefined8 *)(sk->data + 0x28) = uVar1;
          *(undefined8 *)(sk->data + 0x30) = uVar2;
          *(undefined8 *)(sk->data + 0x38) = uVar3;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l5_full_keygen(picnic_l5_full_publickey_t* pk,
                                                  picnic_l5_full_privatekey_t* sk) {
  if (!pk || !sk) {
    return -1;
  }

  uint8_t* sk_sk = SK_SK(sk);
  uint8_t* sk_pt = SK_PT(sk);
  uint8_t* sk_c  = SK_C(sk);

  // generate private key
  // random secret key
  if (rand_bits(sk_sk, LOWMC_BLOCK_BITS)) {
    return -1;
  }
  // random plain text
  if (rand_bits(sk_pt, LOWMC_BLOCK_BITS)) {
    return -1;
  }
  // encrypt plaintext under secret key
  if (picnic_l5_full_sk_to_pk(sk, pk)) {
    return -1;
  }
  // copy ciphertext to secret key
  memcpy(sk_c, PK_C(pk), LOWMC_BLOCK_SZ);
  return 0;
}